

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

uint32_t kex_method_list(uchar *buf,uint32_t list_strlen,LIBSSH2_COMMON_METHOD **method)

{
  char *__s;
  size_t sVar1;
  LIBSSH2_COMMON_METHOD *pLVar2;
  uint32_t uVar3;
  LIBSSH2_COMMON_METHOD **ppLVar4;
  uchar *__dest;
  uchar *puVar5;
  
  _libssh2_htonu32(buf,list_strlen);
  uVar3 = 4;
  if ((method != (LIBSSH2_COMMON_METHOD **)0x0) &&
     (pLVar2 = *method, pLVar2 != (LIBSSH2_COMMON_METHOD *)0x0)) {
    __dest = buf + 4;
    ppLVar4 = method + 1;
    do {
      __s = pLVar2->name;
      if (__s == (char *)0x0) break;
      sVar1 = strlen(__s);
      memcpy(__dest,__s,sVar1 & 0xffffffff);
      puVar5 = __dest + (sVar1 & 0xffffffff);
      __dest = puVar5 + 1;
      *puVar5 = ',';
      pLVar2 = *ppLVar4;
      ppLVar4 = ppLVar4 + 1;
    } while (pLVar2 != (LIBSSH2_COMMON_METHOD *)0x0);
    uVar3 = list_strlen + 4;
  }
  return uVar3;
}

Assistant:

static uint32_t
kex_method_list(unsigned char *buf, uint32_t list_strlen,
                LIBSSH2_COMMON_METHOD ** method)
{
    _libssh2_htonu32(buf, list_strlen);
    buf += 4;

    if(!method || !*method) {
        return 4;
    }

    while(*method && (*method)->name) {
        uint32_t mlen = (uint32_t)strlen((*method)->name);
        memcpy(buf, (*method)->name, mlen);
        buf += mlen;
        *(buf++) = ',';
        method++;
    }

    return list_strlen + 4;
}